

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImageStringUp16(gdImagePtr im,gdFontPtr f,int x,int y,unsigned_short *s,int color)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (*s == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      lVar1 = uVar2 + 1;
      uVar2 = uVar2 + 1;
    } while (s[lVar1] != 0);
  }
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      gdImageCharUp(im,f,x,y,(uint)s[uVar3],color);
      y = y - f->w;
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0xffffffff) != uVar3);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageStringUp16 (gdImagePtr im, gdFontPtr f,
									 int x, int y, unsigned short *s, int color)
{
	int i;
	int l;
	l = strlen16 (s);
	for (i = 0; (i < l); i++) {
		gdImageCharUp (im, f, x, y, s[i], color);
		y -= f->w;
	}
}